

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::onAvailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  pointer pCVar1;
  long lVar2;
  long lVar3;
  pointer __args_3;
  int32_t counterId_local;
  __shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> local_48;
  ClientConductor *local_38;
  
  std::recursive_mutex::lock(&this->m_adminLock);
  __args_3 = (this->m_counters).
             super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pCVar1 - (long)__args_3;
  for (lVar2 = lVar3 / 0x60 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (__args_3->m_registrationId == registrationId) goto LAB_0014a8e9;
    if (__args_3[1].m_registrationId == registrationId) {
      __args_3 = __args_3 + 1;
      goto LAB_0014a8e9;
    }
    if (__args_3[2].m_registrationId == registrationId) {
      __args_3 = __args_3 + 2;
      goto LAB_0014a8e9;
    }
    if (__args_3[3].m_registrationId == registrationId) {
      __args_3 = __args_3 + 3;
      goto LAB_0014a8e9;
    }
    __args_3 = __args_3 + 4;
    lVar3 = lVar3 + -0x180;
  }
  lVar3 = lVar3 / 0x60;
  if (lVar3 == 1) {
LAB_0014a8c9:
    if (__args_3->m_registrationId != registrationId) {
      __args_3 = pCVar1;
    }
  }
  else if (lVar3 == 2) {
LAB_0014a8bf:
    if (__args_3->m_registrationId != registrationId) {
      __args_3 = __args_3 + 1;
      goto LAB_0014a8c9;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_0014a972;
    if (__args_3->m_registrationId != registrationId) {
      __args_3 = __args_3 + 1;
      goto LAB_0014a8bf;
    }
  }
LAB_0014a8e9:
  if ((__args_3 != pCVar1) && (__args_3->m_status == AWAITING_MEDIA_DRIVER)) {
    __args_3->m_status = REGISTERED_MEDIA_DRIVER;
    __args_3->m_counterId = counterId;
    local_38 = this;
    std::
    make_shared<aeron::Counter,aeron::ClientConductor*,aeron::concurrent::AtomicBuffer&,long&,int&>
              ((ClientConductor **)&local_48,(AtomicBuffer *)&local_38,
               (long *)this->m_counterValuesBuffer,(int *)__args_3);
    std::__shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__args_3->m_counterCache).
                super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__weak_ptr<aeron::Counter,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<aeron::Counter,void>
              ((__weak_ptr<aeron::Counter,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               &(__args_3->m_counterCache).
                super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>);
    std::__weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__args_3->m_counter).super___weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_refcount);
  }
LAB_0014a972:
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::operator()
            (&this->m_onAvailableCounterHandler,&this->m_countersReader,registrationId,counterId);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onAvailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end() && (*counterIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        CounterStateDefn& state = (*counterIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_counterId = counterId;
        state.m_counterCache = std::make_shared<Counter>(this, m_counterValuesBuffer, state.m_registrationId, counterId);
        state.m_counter = std::weak_ptr<Counter>(state.m_counterCache);
    }

    m_onAvailableCounterHandler(m_countersReader, registrationId, counterId);
}